

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

void __thiscall cfd::core::Serializer::AddVariableBuffer(Serializer *this,ByteData *buffer)

{
  CfdException *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  undefined1 local_58 [32];
  uint8_t *local_38;
  long local_30;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,&buffer->data_);
  if ((ulong)(local_30 - (long)local_38) >> 0x20 == 0) {
    AddVariableBuffer(this,local_38,(uint32_t)(local_30 - (long)local_38));
    if (local_38 != (uint8_t *)0x0) {
      operator_delete(local_38);
    }
    return;
  }
  local_58._0_8_ = "cfdcore_bytedata.cpp";
  local_58._8_4_ = 0x184;
  local_58._16_8_ = "AddVariableBuffer";
  logger::log<>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"It exceeds the handling size.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._0_8_ = local_58 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"It exceeds the handling size.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Serializer::AddVariableBuffer(const ByteData& buffer) {
  auto buf = buffer.GetBytes();
  if (buf.size() > std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "It exceeds the handling size.");
    throw CfdException(kCfdIllegalStateError, "It exceeds the handling size.");
  }
  AddVariableBuffer(buf.data(), static_cast<uint32_t>(buf.size()));
}